

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

void __thiscall
BackwardPass::ClearBucketsOnFieldKill<ObjTypeGuardBucket>
          (BackwardPass *this,Instr *instr,
          HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator> *table)

{
  Opnd *this_00;
  bool bVar1;
  RegOpnd *pRVar2;
  
  if (table != (HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator> *)0x0) {
    bVar1 = IR::Instr::UsesAllFields(instr);
    if (bVar1) {
      HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator>::ClearAll(table);
      return;
    }
    this_00 = instr->m_dst;
    if (this_00 != (Opnd *)0x0) {
      bVar1 = IR::Opnd::IsRegOpnd(this_00);
      if (bVar1) {
        pRVar2 = IR::Opnd::AsRegOpnd(this_00);
        HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator>::Clear
                  (table,(pRVar2->m_sym->super_Sym).m_id);
        return;
      }
    }
  }
  return;
}

Assistant:

void
BackwardPass::ClearBucketsOnFieldKill(IR::Instr *instr, HashTable<T> *table)
{
    if (table)
    {
        if (instr->UsesAllFields())
        {
            table->ClearAll();
        }
        else
        {
            IR::Opnd *dst = instr->GetDst();
            if (dst && dst->IsRegOpnd())
            {
                table->Clear(dst->AsRegOpnd()->m_sym->m_id);
            }
        }
    }
}